

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

int mz_deflate(mz_streamp pStream,int flush)

{
  tdefl_status tVar1;
  mz_uint32 mVar2;
  void *pIn_buf;
  size_t *pIn_buf_size;
  int in_ESI;
  long *in_RDI;
  tdefl_status defl_status;
  int mz_status;
  mz_ulong orig_total_out;
  mz_ulong orig_total_in;
  size_t out_bytes;
  size_t in_bytes;
  size_t *pOut_buf_size;
  void *pOut_buf;
  undefined4 in_stack_ffffffffffffffe8;
  tdefl_flush local_4;
  
  local_4 = TDEFL_NO_FLUSH;
  if ((((in_RDI == (long *)0x0) || (in_RDI[7] == 0)) || (in_ESI < 0)) ||
     ((4 < in_ESI || (in_RDI[3] == 0)))) {
    local_4 = 0xfffffffe;
  }
  else if ((int)in_RDI[4] == 0) {
    local_4 = ~TDEFL_FINISH;
  }
  else {
    if (in_ESI == 1) {
      in_ESI = 2;
    }
    if (*(int *)(in_RDI[7] + 0x84) == 1) {
      local_4 = ~TDEFL_FINISH;
      if (in_ESI == 4) {
        local_4 = 1;
      }
    }
    else {
      pOut_buf = (void *)in_RDI[2];
      pOut_buf_size = (size_t *)in_RDI[5];
      do {
        pIn_buf = (void *)(ulong)*(uint *)(in_RDI + 1);
        pIn_buf_size = (size_t *)(ulong)*(uint *)(in_RDI + 4);
        tVar1 = tdefl_compress((tdefl_compressor *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                               pIn_buf,pIn_buf_size,pOut_buf,pOut_buf_size,local_4);
        *in_RDI = *in_RDI + ((ulong)pIn_buf & 0xffffffff);
        *(int *)(in_RDI + 1) = (int)in_RDI[1] - (int)pIn_buf;
        in_RDI[2] = ((ulong)pIn_buf & 0xffffffff) + in_RDI[2];
        mVar2 = tdefl_get_adler32((tdefl_compressor *)in_RDI[7]);
        in_RDI[0xc] = (ulong)mVar2;
        in_RDI[3] = in_RDI[3] + ((ulong)pIn_buf_size & 0xffffffff);
        *(int *)(in_RDI + 4) = (int)in_RDI[4] - (int)pIn_buf_size;
        in_RDI[5] = ((ulong)pIn_buf_size & 0xffffffff) + in_RDI[5];
        if (tVar1 < TDEFL_STATUS_OKAY) {
          return -2;
        }
        if (tVar1 == TDEFL_STATUS_DONE) {
          return 1;
        }
        if ((int)in_RDI[4] == 0) {
          return local_4;
        }
      } while (((int)in_RDI[1] != 0) || (in_ESI == 4));
      if ((in_ESI == 0) &&
         (((void *)in_RDI[2] == pOut_buf && ((size_t *)in_RDI[5] == pOut_buf_size)))) {
        local_4 = ~TDEFL_FINISH;
      }
    }
  }
  return local_4;
}

Assistant:

int mz_deflate(mz_streamp pStream, int flush) {
  size_t in_bytes, out_bytes;
  mz_ulong orig_total_in, orig_total_out;
  int mz_status = MZ_OK;

  if ((!pStream) || (!pStream->state) || (flush < 0) || (flush > MZ_FINISH) || (!pStream->next_out))
    return MZ_STREAM_ERROR;
  if (!pStream->avail_out)
    return MZ_BUF_ERROR;

  if (flush == MZ_PARTIAL_FLUSH)
    flush = MZ_SYNC_FLUSH;

  if (((tdefl_compressor*)pStream->state)->m_prev_return_status == TDEFL_STATUS_DONE)
    return (flush == MZ_FINISH) ? MZ_STREAM_END : MZ_BUF_ERROR;

  orig_total_in = pStream->total_in;
  orig_total_out = pStream->total_out;
  for (;;) {
    tdefl_status defl_status;
    in_bytes = pStream->avail_in;
    out_bytes = pStream->avail_out;

    defl_status = tdefl_compress((tdefl_compressor*)pStream->state, pStream->next_in, &in_bytes, pStream->next_out, &out_bytes, (tdefl_flush)flush);
    pStream->next_in += (mz_uint)in_bytes;
    pStream->avail_in -= (mz_uint)in_bytes;
    pStream->total_in += (mz_uint)in_bytes;
    pStream->adler = tdefl_get_adler32((tdefl_compressor*)pStream->state);

    pStream->next_out += (mz_uint)out_bytes;
    pStream->avail_out -= (mz_uint)out_bytes;
    pStream->total_out += (mz_uint)out_bytes;

    if (defl_status < 0) {
      mz_status = MZ_STREAM_ERROR;
      break;
    } else if (defl_status == TDEFL_STATUS_DONE) {
      mz_status = MZ_STREAM_END;
      break;
    } else if (!pStream->avail_out)
      break;
    else if ((!pStream->avail_in) && (flush != MZ_FINISH)) {
      if ((flush) || (pStream->total_in != orig_total_in) || (pStream->total_out != orig_total_out))
        break;
      return MZ_BUF_ERROR;  // Can't make forward progress without some input.
    }
  }
  return mz_status;
}